

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int ossl_do_file_type(char *type)

{
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  if ((type != (char *)0x0) && (*type != '\0')) {
    iVar1 = curl_strequal(type,"PEM");
    if (iVar1 == 0) {
      iVar1 = curl_strequal(type,"DER");
      uVar2 = 2;
      if (iVar1 == 0) {
        iVar1 = curl_strequal(type,"PROV");
        uVar2 = 0x2c;
        if (iVar1 == 0) {
          iVar1 = curl_strequal(type,"ENG");
          uVar2 = 0x2a;
          if (iVar1 == 0) {
            iVar1 = curl_strequal(type,"P12");
            uVar2 = -(uint)(iVar1 == 0) | 0x2b;
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int ossl_do_file_type(const char *type)
{
  if(!type || !type[0])
    return SSL_FILETYPE_PEM;
  if(strcasecompare(type, "PEM"))
    return SSL_FILETYPE_PEM;
  if(strcasecompare(type, "DER"))
    return SSL_FILETYPE_ASN1;
  if(strcasecompare(type, "PROV"))
    return SSL_FILETYPE_PROVIDER;
  if(strcasecompare(type, "ENG"))
    return SSL_FILETYPE_ENGINE;
  if(strcasecompare(type, "P12"))
    return SSL_FILETYPE_PKCS12;
  return -1;
}